

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::multIntToReg
               (CodeGen *codeGen,Registers destReg,int srcValue,bool is32bits)

{
  ulong local_28;
  size_t i;
  IntToBytes converter;
  bool is32bits_local;
  int srcValue_local;
  Registers destReg_local;
  CodeGen *codeGen_local;
  
  i._7_1_ = is32bits;
  converter.intValue = srcValue;
  is32bits_local = (bool)destReg;
  _srcValue_local = codeGen;
  if (!is32bits) {
    i._6_1_ = 0x48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,(value_type_conflict1 *)((long)&i + 6));
  }
  i._5_1_ = 0x69;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_srcValue_local,(value_type_conflict1 *)((long)&i + 5));
  i._4_1_ = is32bits_local | 0xc0U | is32bits_local << 3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_srcValue_local,(value_type_conflict1 *)((long)&i + 4));
  i._0_4_ = converter;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_srcValue_local,(value_type_conflict1 *)((long)&i + local_28));
  }
  return;
}

Assistant:

void Amd64Backend::multIntToReg(CodeGen& codeGen, Registers destReg, int srcValue, bool is32bits) {
		if (!is32bits) {
			codeGen.push_back(0x48);
		}

		codeGen.push_back(0x69);
		codeGen.push_back(0xc0 | (Byte)destReg | ((Byte)destReg << 3));

		IntToBytes converter;
		converter.intValue = srcValue;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}